

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abstractscrollarea.cpp
# Opt level: O3

void __thiscall
QtMWidgets::AbstractScrollAreaPrivate::layoutChildren
          (AbstractScrollAreaPrivate *this,QStyleOption *opt)

{
  QRect *pQVar1;
  BlurEffect *pBVar2;
  int iVar3;
  QRect QVar4;
  QRect local_40;
  
  QVar4 = (QRect)QWidget::contentsRect();
  local_40 = QVar4;
  iVar3 = QWidget::layoutDirection();
  local_40.x1 = (&this->right)[iVar3 != 1] + QVar4.x1;
  local_40.y2 = QVar4.y2 - this->bottom;
  local_40.y1 = QVar4.y1 + this->top;
  local_40.x2 = QVar4.x2 - (&this->right)[iVar3 == 1];
  pQVar1 = (QRect *)this->viewport;
  QStyle::visualRect(*(LayoutDirection *)(opt + 0xc),(QRect *)(opt + 0x10),&local_40);
  QWidget::setGeometry(pQVar1);
  pBVar2 = this->horBlur;
  (**(code **)((long)*(QSize *)pBVar2 + 0x70))(pBVar2);
  QWidget::resize((QSize *)pBVar2);
  pBVar2 = this->vertBlur;
  (**(code **)((long)*(QSize *)pBVar2 + 0x70))(pBVar2);
  QWidget::resize((QSize *)pBVar2);
  return;
}

Assistant:

void
AbstractScrollAreaPrivate::layoutChildren( const QStyleOption & opt )
{
	QRect viewportRect = q->contentsRect();

	if( q->isRightToLeft() )
		viewportRect.adjust( right, top, -left, -bottom );
	else
		viewportRect.adjust( left, top, -right, -bottom );

	viewport->setGeometry( QStyle::visualRect( opt.direction, opt.rect,
		viewportRect ) );

	horBlur->resize( horBlur->sizeHint().width(),
		viewportRect.height() * 0.75 );

	vertBlur->resize( viewportRect.width() * 0.75,
		vertBlur->sizeHint().height() );
}